

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyalloc.c
# Opt level: O0

void allocator_reset(tommy_allocator *alloc)

{
  long lVar1;
  tommy_allocator_entry_struct *ptVar2;
  long in_FS_OFFSET;
  tommy_allocator_entry *block_next;
  tommy_allocator_entry *block;
  tommy_allocator *alloc_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  block_next = alloc->used_segment;
  while (block_next != (tommy_allocator_entry *)0x0) {
    ptVar2 = block_next->next;
    lrtr_free(block_next);
    block_next = ptVar2;
  }
  alloc->count = 0;
  alloc->free_block = (tommy_allocator_entry_struct *)0x0;
  alloc->used_segment = (tommy_allocator_entry_struct *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void allocator_reset(tommy_allocator* alloc)
{
	tommy_allocator_entry* block = alloc->used_segment;

	while (block) {
		tommy_allocator_entry* block_next = block->next;
		tommy_free(block);
		block = block_next;
	}

	alloc->count = 0;
	alloc->free_block = 0;
	alloc->used_segment = 0;
}